

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O3

string * __thiscall Cpu::lookup_abi_cxx11_(string *__return_storage_ptr__,Cpu *this)

{
  ushort uVar1;
  ushort uVar2;
  ostream *poVar3;
  char *pcVar4;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ostringstream outs;
  undefined1 *local_1e0 [2];
  undefined1 local_1d0 [16];
  char *local_1c0;
  size_type local_1b8;
  char local_1b0;
  undefined7 uStack_1af;
  undefined8 uStack_1a8;
  long local_1a0 [3];
  uint auStack_188 [22];
  ios_base local_130 [264];
  
  local_1c0 = &local_1b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  uVar1 = this->ROM[this->pc];
  if (uVar1 == 0xfff) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"END","");
    goto LAB_0010513c;
  }
  uVar2 = uVar1 >> 8;
  bVar5 = (byte)uVar1;
  if (uVar2 == 0xc) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"mov w, #",8);
    *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) =
         *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) & 0xffffffb5 | 8;
    std::ostream::operator<<((ostream *)local_1a0,(uint)bVar5);
    std::__cxx11::stringbuf::str();
LAB_001050d5:
    std::__cxx11::string::operator=((string *)&local_1c0,(string *)local_1e0);
    if (local_1e0[0] != local_1d0) {
      operator_delete(local_1e0[0]);
    }
  }
  else {
    uVar6 = (uint)uVar1;
    if (uVar2 == 0xb) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"jmp ",4);
      *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) =
           *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) & 0xffffffb5 | 8;
      std::ostream::operator<<((ostream *)local_1a0,uVar6 & 0x1ff);
      std::__cxx11::stringbuf::str();
      goto LAB_001050d5;
    }
    if (uVar2 == 10) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"jmp ",4);
      *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) =
           *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) & 0xffffffb5 | 8;
      std::ostream::operator<<((ostream *)local_1a0,(uint)bVar5);
      std::__cxx11::stringbuf::str();
      goto LAB_001050d5;
    }
    uVar8 = (uint)(uVar1 >> 5);
    uVar7 = (uint)uVar1;
    if (uVar8 == 1) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"mov ",4);
      *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) =
           *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) & 0xffffffb5 | 8;
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,uVar7 & 0x1f);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,", w",3);
      std::__cxx11::stringbuf::str();
      goto LAB_001050d5;
    }
    if (uVar2 == 5) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"setb ",5);
      *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) =
           *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) & 0xffffffb5 | 8;
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,uVar7 & 0x1f);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,".",1);
      std::ostream::operator<<(poVar3,uVar8 & 7);
      std::__cxx11::stringbuf::str();
      goto LAB_001050d5;
    }
    if (uVar8 == 0xe) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"add w, ",7);
      *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) =
           *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) & 0xffffffb5 | 8;
      std::ostream::operator<<((ostream *)local_1a0,uVar6 & 0x1f);
      std::__cxx11::stringbuf::str();
      goto LAB_001050d5;
    }
    if (uVar8 == 0xf) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"add ",4);
      *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) =
           *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) & 0xffffffb5 | 8;
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,uVar7 & 0x1f);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,", w",3);
      std::__cxx11::stringbuf::str();
      goto LAB_001050d5;
    }
    if (uVar2 == 6) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"snb ",4);
      *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) =
           *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) & 0xffffffb5 | 8;
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,uVar7 & 0x1f);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,".",1);
      std::ostream::operator<<(poVar3,uVar8 & 7);
      std::__cxx11::stringbuf::str();
      goto LAB_001050d5;
    }
    if (uVar8 == 10) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"and w, ",7);
      *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) =
           *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) & 0xffffffb5 | 8;
      std::ostream::operator<<((ostream *)local_1a0,uVar6 & 0x1f);
      std::__cxx11::stringbuf::str();
      goto LAB_001050d5;
    }
    if (uVar8 == 0xb) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"and ",4);
      *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) =
           *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) & 0xffffffb5 | 8;
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,uVar7 & 0x1f);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,", w",3);
      std::__cxx11::stringbuf::str();
      goto LAB_001050d5;
    }
    if (uVar2 == 0xe) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"and w, #",8);
      *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) =
           *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) & 0xffffffb5 | 8;
      std::ostream::operator<<((ostream *)local_1a0,(uint)bVar5);
      std::__cxx11::stringbuf::str();
      goto LAB_001050d5;
    }
    if (uVar8 == 9) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"or ",3);
      *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) =
           *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) & 0xffffffb5 | 8;
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,uVar6 & 0x1f);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,", w",3);
      std::__cxx11::stringbuf::str();
      goto LAB_001050d5;
    }
    if (uVar8 == 0x13) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"not ",4);
      *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) =
           *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) & 0xffffffb5 | 8;
      std::ostream::operator<<((ostream *)local_1a0,uVar7 & 0x1f);
      std::__cxx11::stringbuf::str();
      goto LAB_001050d5;
    }
    if (uVar2 == 0xd) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"or w, #",7);
      *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) =
           *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) & 0xffffffb5 | 8;
      std::ostream::operator<<((ostream *)local_1a0,(uint)bVar5);
      std::__cxx11::stringbuf::str();
      goto LAB_001050d5;
    }
    if (uVar8 == 0xd) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"xor ",4);
      *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) =
           *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) & 0xffffffb5 | 8;
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,uVar6 & 0x1f);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,", w",3);
      std::__cxx11::stringbuf::str();
      goto LAB_001050d5;
    }
    if (uVar8 == 0xc) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"xor w, ",7);
      *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) =
           *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) & 0xffffffb5 | 8;
      std::ostream::operator<<((ostream *)local_1a0,uVar6 & 0x1f);
      std::__cxx11::stringbuf::str();
      goto LAB_001050d5;
    }
    if (uVar8 == 8) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"or w, ",6);
      *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) =
           *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) & 0xffffffb5 | 8;
      std::ostream::operator<<((ostream *)local_1a0,uVar7 & 0x1f);
      std::__cxx11::stringbuf::str();
      goto LAB_001050d5;
    }
    if (uVar2 == 0xf) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"xor w, #",8);
      *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) =
           *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) & 0xffffffb5 | 8;
      std::ostream::operator<<((ostream *)local_1a0,(uint)bVar5);
      std::__cxx11::stringbuf::str();
      goto LAB_001050d5;
    }
    if (uVar8 == 3) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"clr ",4);
      *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) =
           *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) & 0xffffffb5 | 8;
      std::ostream::operator<<((ostream *)local_1a0,uVar7 & 0x1f);
      std::__cxx11::stringbuf::str();
      goto LAB_001050d5;
    }
    if (uVar6 == 0x40) {
      pcVar4 = "clr w";
    }
    else {
      if (uVar7 != 4) {
        if (uVar8 == 7) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"dec ",4);
          *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) =
               *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) & 0xffffffb5 | 8;
          std::ostream::operator<<((ostream *)local_1a0,uVar7 & 0x1f);
          std::__cxx11::stringbuf::str();
        }
        else if (uVar2 == 7) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"sb ",3);
          *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) =
               *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) & 0xffffffb5 | 8;
          poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,uVar7 & 0x1f);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,".",1);
          std::ostream::operator<<(poVar3,uVar8 & 7);
          std::__cxx11::stringbuf::str();
        }
        else {
          switch(uVar8 - 5 >> 1 | (uint)((uVar8 - 5 & 1) != 0) << 0x1f) {
          case 0:
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"sub ",4);
            *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) =
                 *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) & 0xffffffb5 | 8;
            poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,uVar7 & 0x1f);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3," w",2);
            std::__cxx11::stringbuf::str();
            break;
          default:
            if (uVar2 == 4) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"clrb ",5);
              *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) =
                   *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) & 0xffffffb5 | 8;
              poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,uVar7 & 0x1f);
              std::__ostream_insert<char,std::char_traits<char>>(poVar3,".",1);
              std::ostream::operator<<(poVar3,uVar8 & 7);
              std::__cxx11::stringbuf::str();
            }
            else {
              switch(uVar8 - 4 >> 1 | (uint)((uVar8 - 4 & 1) != 0) << 0x1f) {
              case 0:
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"mov w, ",7)
                ;
                *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) =
                     *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) & 0xffffffb5 | 8
                ;
                poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,uVar7 & 0x1f);
                std::__ostream_insert<char,std::char_traits<char>>(poVar3,"-w",2);
                std::__cxx11::stringbuf::str();
                break;
              case 1:
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a0,"mov w, --",9);
                *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) =
                     *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) & 0xffffffb5 | 8
                ;
                std::ostream::operator<<((ostream *)local_1a0,uVar7 & 0x1f);
                std::__cxx11::stringbuf::str();
                break;
              default:
                if (uVar7 == 0x43) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a0,"mov m, w",8);
                  std::__cxx11::stringbuf::str();
                }
                else if ((uVar7 & 0xfffffff0) == 0x50) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a0,"mov m, #",8);
                  *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) =
                       *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) & 0xffffffb5 |
                       8;
                  std::ostream::operator<<((ostream *)local_1a0,uVar7 & 0xf);
                  std::__cxx11::stringbuf::str();
                }
                else if (uVar7 == 2) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a0,"mov !option, w",0xe);
                  std::__cxx11::stringbuf::str();
                }
                else if ((ushort)(uVar1 - 5) < 5) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a0,"mov !rx, w",10);
                  std::__cxx11::stringbuf::str();
                }
                else if (uVar8 == 0x11) {
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"test ",5)
                  ;
                  *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) =
                       *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) & 0xffffffb5 |
                       8;
                  std::ostream::operator<<((ostream *)local_1a0,uVar7 & 0x1f);
                  std::__cxx11::stringbuf::str();
                }
                else if (uVar7 == 0) {
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"nop",3);
                  std::__cxx11::stringbuf::str();
                }
                else if (uVar2 == 9) {
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"call ",5)
                  ;
                  *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) =
                       *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) & 0xffffffb5 |
                       8;
                  std::ostream::operator<<
                            ((ostream *)local_1a0,(uint)bVar5 | (*this->status & 0xffffffe0) << 4);
                  std::__cxx11::stringbuf::str();
                }
                else if (uVar7 == 0xd) {
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"retp",4);
                  std::__cxx11::stringbuf::str();
                }
                else if (uVar6 == 0xc) {
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"ret",3);
                  std::__cxx11::stringbuf::str();
                }
                else if (uVar2 == 8) {
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"retw ",5)
                  ;
                  *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) =
                       *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) & 0xffffffb5 |
                       8;
                  std::ostream::operator<<((ostream *)local_1a0,(uint)bVar5);
                  std::__cxx11::stringbuf::str();
                }
                else if (uVar1 >> 3 == 2) {
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"page ",5)
                  ;
                  *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) =
                       *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) & 0xffffffb5 |
                       8;
                  std::ostream::operator<<((ostream *)local_1a0,uVar7 & 7);
                  std::__cxx11::stringbuf::str();
                }
                else if (uVar1 >> 3 == 3) {
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"bank ",5)
                  ;
                  *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) =
                       *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) & 0xffffffb5 |
                       8;
                  std::ostream::operator<<((ostream *)local_1a0,uVar7 & 7);
                  std::__cxx11::stringbuf::str();
                }
                else if (uVar7 == 0x41) {
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"IREAD",5)
                  ;
                  std::__cxx11::stringbuf::str();
                }
                else {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a0,"not impl ",9);
                  *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) =
                       *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) & 0xffffffb5 |
                       8;
                  std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
                  std::__cxx11::stringbuf::str();
                }
                break;
              case 6:
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"mov w, ",7)
                ;
                *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) =
                     *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) & 0xffffffb5 | 8
                ;
                std::ostream::operator<<((ostream *)local_1a0,uVar7 & 0x1f);
                std::__cxx11::stringbuf::str();
                break;
              case 7:
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a0,"mov w, /",8);
                *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) =
                     *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) & 0xffffffb5 | 8
                ;
                std::ostream::operator<<((ostream *)local_1a0,uVar7 & 0x1f);
                std::__cxx11::stringbuf::str();
                break;
              case 8:
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a0,"mov w, ++",9);
                *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) =
                     *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) & 0xffffffb5 | 8
                ;
                std::ostream::operator<<((ostream *)local_1a0,uVar7 & 0x1f);
                std::__cxx11::stringbuf::str();
                break;
              case 9:
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a0,"movsz w, --",0xb);
                *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) =
                     *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) & 0xffffffb5 | 8
                ;
                std::ostream::operator<<((ostream *)local_1a0,uVar7 & 0x1f);
                std::__cxx11::stringbuf::str();
                break;
              case 10:
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a0,"mov w, <<",9);
                *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) =
                     *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) & 0xffffffb5 | 8
                ;
                std::ostream::operator<<((ostream *)local_1a0,uVar7 & 0x1f);
                std::__cxx11::stringbuf::str();
                break;
              case 0xb:
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a0,"mov w, <<",9);
                *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) =
                     *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) & 0xffffffb5 | 8
                ;
                std::ostream::operator<<((ostream *)local_1a0,uVar7 & 0x1f);
                std::__cxx11::stringbuf::str();
                break;
              case 0xc:
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a0,"mov w, <>",9);
                *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) =
                     *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) & 0xffffffb5 | 8
                ;
                std::ostream::operator<<((ostream *)local_1a0,uVar7 & 0x1f);
                std::__cxx11::stringbuf::str();
                break;
              case 0xd:
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a0,"movsz w, ++",0xb);
                *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) =
                     *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) & 0xffffffb5 | 8
                ;
                std::ostream::operator<<((ostream *)local_1a0,uVar7 & 0x1f);
                std::__cxx11::stringbuf::str();
              }
            }
            break;
          case 8:
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"inc ",4);
            *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) =
                 *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) & 0xffffffb5 | 8;
            std::ostream::operator<<((ostream *)local_1a0,uVar7 & 0x1f);
            std::__cxx11::stringbuf::str();
            break;
          case 9:
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"decsz ",6);
            *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) =
                 *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) & 0xffffffb5 | 8;
            std::ostream::operator<<((ostream *)local_1a0,uVar7 & 0x1f);
            std::__cxx11::stringbuf::str();
            break;
          case 10:
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"RR ",3);
            *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) =
                 *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) & 0xffffffb5 | 8;
            std::ostream::operator<<((ostream *)local_1a0,uVar7 & 0x1f);
            std::__cxx11::stringbuf::str();
            break;
          case 0xb:
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"RL ",3);
            *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) =
                 *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) & 0xffffffb5 | 8;
            std::ostream::operator<<((ostream *)local_1a0,uVar7 & 0x1f);
            std::__cxx11::stringbuf::str();
            break;
          case 0xc:
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"swap ",5);
            *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) =
                 *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) & 0xffffffb5 | 8;
            std::ostream::operator<<((ostream *)local_1a0,uVar7 & 0x1f);
            std::__cxx11::stringbuf::str();
            break;
          case 0xd:
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"incsz ",6);
            *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) =
                 *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) & 0xffffffb5 | 8;
            std::ostream::operator<<((ostream *)local_1a0,uVar7 & 0x1f);
            std::__cxx11::stringbuf::str();
          }
        }
        goto LAB_001050d5;
      }
      pcVar4 = "clr !WDT";
    }
    std::__cxx11::string::operator=((string *)&local_1c0,pcVar4);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (local_1c0 == &local_1b0) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_1af,local_1b0);
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_1a8;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_1c0;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_1af,local_1b0);
  }
  __return_storage_ptr__->_M_string_length = local_1b8;
  local_1b8 = 0;
  local_1b0 = '\0';
  local_1c0 = &local_1b0;
LAB_0010513c:
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  std::ios_base::~ios_base(local_130);
  if (local_1c0 != &local_1b0) {
    operator_delete(local_1c0);
  }
  return __return_storage_ptr__;
}

Assistant:

string Cpu::lookup()
{
	string
	op = "";
	ostringstream outs;
	USHORT
	mne = ROM[pc];
	if (mne == 0xfff)
	{
		return "END";
	}
	if (mne >> 8 == 0xa)
	{				//jmp
		outs << "jmp " << hex << (mne & 0x1ff);
		op = outs.str();
		return op;
	}
	else if (mne >> 8 == 0xb)
	{				//jmp
		outs << "jmp " << hex << (mne & 0x1ff);
		op = outs.str();
		return op;
	}
	else if (mne >> 8 == 0xc)
	{				//mov w,lit
		outs << "mov w, #" << hex << (mne & 0xff);
		op = outs.str();
	}
	else if (mne >> 5 == 1)
	{				//mov fr,w
		outs << "mov " << hex << (mne & 0x1f) << ", w";
		op = outs.str();
	}
	else if (mne >> 8 == 5)
	{				//setb fr.bit
		int
		bit = (mne >> 5) & 7;
		outs << "setb " << hex << (mne & 0x1f) << "." << bit;
		op = outs.str();

	}
	else if (mne >> 5 == 0xf)
	{				//add fr,w
		outs << "add " << hex << (mne & 0x1f) << ", w";
		op = outs.str();
	}
	else if (mne >> 5 == 0xe)
	{				//add w,fr
		outs << "add w, " << hex << (mne & 0x1f);
		op = outs.str();
	}
	else if (mne >> 8 == 6)
	{				//snb fr.bit
		int
		bit = (mne >> 5) & 7;
		outs << "snb " << hex << (mne & 0x1f) << "." << bit;
		op = outs.str();
	}
	else if (mne >> 5 == 11)
	{				//and fr,w
		outs << "and " << hex << (mne & 0x1f) << ", w";
		op = outs.str();
	}
	else if (mne >> 5 == 10)
	{				//and w,fr
		outs << "and w, " << hex << (mne & 0x1f);
		op = outs.str();
	}
	else if (mne >> 8 == 0xe)
	{				//and w,#lit
		outs << "and w, #" << hex << (mne & 0xff);
		op = outs.str();
	}
	else if (mne >> 5 == 0x13)
	{				//not fr
		outs << "not " << hex << (mne & 0x1f);
		op = outs.str();
	}
	else if (mne >> 5 == 9)
	{				//or fr,w
		outs << "or " << hex << (mne & 0x1f) << ", w";
		op = outs.str();
	}
	else if (mne >> 8 == 0xd)
	{				//or w,#lit
		outs << "or w, #" << hex << (mne & 0xff);
		op = outs.str();
	}
	else if (mne >> 5 == 8)
	{				//or w,fr
		outs << "or w, " << hex << (mne & 0x1f);
		op = outs.str();

	}
	else if (mne >> 5 == 13)
	{				//xor fr,w
		outs << "xor " << hex << (mne & 0x1f) << ", w";
		op = outs.str();
	}
	else if (mne >> 5 == 12)
	{				//xor w,fr
		outs << "xor w, " << hex << (mne & 0x1f);
		op = outs.str();
	}
	else if (mne >> 8 == 0xf)
	{				//xor w,#lit
		outs << "xor w, #" << hex << (mne & 0xff);
		op = outs.str();
	}
	else if (mne >> 5 == 3)
	{				//clr fr
		outs << "clr " << hex << (mne & 0x1f);
		op = outs.str();
	}
	else if (mne == 0x40)
	{				//clr w
		op = "clr w";
	}
	else if (mne == 4)
	{				//clr !WDT
		op = "clr !WDT";
	}
	else if (mne >> 5 == 7)
	{				//dec fr
		outs << "dec " << hex << (mne & 0x1f);
		op = outs.str();
	}
	else if (mne >> 8 == 7)
	{				//sb fr.bit
		int
		bit = (mne >> 5) & 7;
		outs << "sb " << hex << (mne & 0x1f) << "." << bit;
		op = outs.str();
	}
	else if (mne >> 5 == 0x17)
	{				//decsz fr
		outs << "decsz " << hex << (mne & 0x1f);
		op = outs.str();
	}
	else if (mne >> 5 == 0x15)
	{				//inc fr
		outs << "inc " << hex << (mne & 0x1f);
		op = outs.str();
	}
	else if (mne >> 5 == 0x1f)
	{				//incsz fr
		outs << "incsz " << hex << (mne & 0x1f);
		op = outs.str();
	}
	else if (mne >> 5 == 0x1b)
	{				//RL fr
		outs << "RL " << hex << (mne & 0x1f);
		op = outs.str();
	}
	else if (mne >> 5 == 0x19)
	{				//RR fr
		outs << "RR " << hex << (mne & 0x1f);
		op = outs.str();
	}
	else if (mne >> 5 == 5)
	{				//sub fr,w
		outs << "sub " << hex << (mne & 0x1f) << " w";
		op = outs.str();
	}
	else if (mne >> 5 == 0x1d)
	{				//swap fr
		outs << "swap " << hex << (mne & 0x1f);
		op = outs.str();
	}
	else if (mne >> 8 == 4)
	{				//clrb fr.bit
		int
		bit = (mne >> 5) & 7;
		outs << "clrb " << hex << (mne & 0x1f) << "." << bit;
		op = outs.str();
	}
	else if (mne >> 5 == 0x10)
	{				//mov w,fr
		outs << "mov w, " << hex << (mne & 0x1f);
		op = outs.str();
	}
	else if (mne >> 5 == 0x4)
	{				//mov w,fr-w
		outs << "mov w, " << hex << (mne & 0x1f) << "-w";
		op = outs.str();
	}
	else if (mne >> 5 == 0x12)
	{				//mov w,/fr (complement)
		outs << "mov w, /" << hex << (mne & 0x1f);
		op = outs.str();
	}
	else if (mne >> 5 == 0x6)
	{				//mov w,--fr
		outs << "mov w, --" << hex << (mne & 0x1f);
		op = outs.str();
	}
	else if (mne >> 5 == 0x14)
	{				//mov w,++fr
		outs << "mov w, ++" << hex << (mne & 0x1f);
		op = outs.str();
	}
	else if (mne >> 5 == 0x1a)
	{				//mov w,<<fr
		outs << "mov w, <<" << hex << (mne & 0x1f);
		op = outs.str();
	}
	else if (mne >> 5 == 0x18)
	{				//mov w,>>fr
		outs << "mov w, <<" << hex << (mne & 0x1f);
		op = outs.str();
	}
	else if (mne >> 5 == 0x1c)
	{				//mov w,<>fr
		outs << "mov w, <>" << hex << (mne & 0x1f);
		op = outs.str();
	}
	//TODO: mov w,m
	else if (mne >> 5 == 0x16)
	{				//movsz w,--fr
		outs << "movsz w, --" << hex << (mne & 0x1f);
		op = outs.str();
	}
	else if (mne >> 5 == 0x1e)
	{				//movsz w,++fr
		outs << "movsz w, ++" << hex << (mne & 0x1f);
		op = outs.str();
	}
	else if (mne == 0x43)
	{ //mov m,w
		outs << "mov m, w";
		op = outs.str();
	}
	else if (mne >> 4 == 0x5)
	{ //mov m,#lit
		outs << "mov m, #" << hex << (mne&0xf);
		op = outs.str();
	}
	else if (mne == 0x2)
	{ //mov !option,w
		outs << "mov !option, w";
		op = outs.str();
	}
	else if (mne > 4 && mne < 10)
	{
		outs << "mov !rx, w";
		op = outs.str();
	}
	//mov !option,w
	else if (mne >> 5 == 0x11)
	{				//test fr
		outs << "test " << hex << (mne & 0x1f);
		op = outs.str();
	}
	else if (mne == 0)
	{				//nop
		outs << "nop";
		op = outs.str();
	}
	else if (mne >> 8 == 9)
	{ //call addr8
		outs << "call " << hex << ((*status & 0xe0) << 4 | mne & 0xff);
		op = outs.str();
	}
	else if (mne == 0xc)
	{ //ret
		outs << "ret";
		op = outs.str();
	}
	else if (mne == 0xd)
	{ //retp
		outs << "retp";
		op = outs.str();
	}
	else if (mne >> 8 == 0x8)
	{ //retw #lit
		outs << "retw " << hex << (mne&0xff);
		op = outs.str();
	}
	else if (mne >> 3 == 3)
	{ //bank addr12
		outs << "bank " << hex << (mne&7);
		op = outs.str();
	}
	else if (mne >> 3 == 2)
	{ //page addr12
		outs << "page " << hex << (mne&7);
		op = outs.str();
	}
	else if (mne == 0x41)
	{ //IREAD
		outs << "IREAD";
		op = outs.str();
	}
	else
	{
		outs << "not impl " << hex << mne;
		op = outs.str();
	}
	return op;
}